

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O3

module_ * __thiscall
pybind11::module_::def<bool(*)(int),pybind11::arg_v>
          (module_ *this,char *name_,_func_bool_int **f,arg_v *extra)

{
  _func_bool_int *f_00;
  cpp_function func;
  handle local_58;
  handle local_50;
  object local_48;
  handle local_40;
  name local_38;
  sibling local_30;
  
  f_00 = *f;
  local_40.m_ptr = (this->super_object).super_handle.m_ptr;
  local_48.super_handle.m_ptr = (handle)&_Py_NoneStruct;
  __Py_NoneStruct = __Py_NoneStruct + 1;
  local_38.value = name_;
  local_58.m_ptr = (PyObject *)PyObject_GetAttrString();
  if (local_58.m_ptr == (PyObject *)0x0) {
    PyErr_Clear();
    local_58.m_ptr = (PyObject *)&_Py_NoneStruct;
    __Py_NoneStruct = __Py_NoneStruct + 1;
  }
  local_30.value.m_ptr = (handle)(handle)local_58.m_ptr;
  cpp_function::
  cpp_function<bool,int,pybind11::name,pybind11::scope,pybind11::sibling,pybind11::arg_v>
            ((cpp_function *)&local_50,f_00,&local_38,(scope *)&local_40,&local_30,extra);
  object::~object((object *)&local_58);
  object::~object(&local_48);
  add_object(this,name_,local_50,true);
  object::~object((object *)&local_50);
  return this;
}

Assistant:

module_ &def(const char *name_, Func &&f, const Extra& ... extra) {
        cpp_function func(std::forward<Func>(f), name(name_), scope(*this),
                          sibling(getattr(*this, name_, none())), extra...);
        // NB: allow overwriting here because cpp_function sets up a chain with the intention of
        // overwriting (and has already checked internally that it isn't overwriting non-functions).
        add_object(name_, func, true /* overwrite */);
        return *this;
    }